

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raii_event_tests.cpp
# Opt level: O1

void __thiscall raii_event_tests::raii_event_creation::test_method(raii_event_creation *this)

{
  mapped_type_conflict1 *pmVar1;
  runtime_error *prVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  raii_event event;
  raii_event_base base_1;
  void *event_ptr;
  void *base_ptr;
  check_type cVar5;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  __uniq_ptr_impl<event_base,_event_base_deleter> local_100;
  _Head_base<0UL,_event_base_*,_false> local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  lazy_ostream local_a0;
  undefined1 *local_90;
  char **local_88;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  __uniq_ptr_impl<event_base,_event_base_deleter> local_48;
  _Tuple_impl<0UL,_event_base_*,_event_base_deleter> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  event_set_mem_functions(tag_malloc,realloc,tag_free);
  local_40.super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
       (_Head_base<0UL,_event_base_*,_false>)(event_base *)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
  super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
       (tuple<event_base_*,_event_base_deleter>)event_base_new();
  if (local_48._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl ==
      (_Tuple_impl<0UL,_event_base_*,_event_base_deleter>)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"cannot create event_base");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_50 = "";
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_60 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2e;
    file.m_begin = (iterator)&local_58;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    local_40.super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
         (_Head_base<0UL,_event_base_*,_false>)
         (_Head_base<0UL,_event_base_*,_false>)
         local_48._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
         super__Head_base<0UL,_event_base_*,_false>._M_head_impl;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
    pmVar1 = std::
             map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
             ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                           *)tags,(key_type *)&local_40);
    local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*pmVar1 == 1);
    local_80.m_message.px = (element_type *)0x0;
    local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_b0 = "tags[base_ptr] == 1";
    local_a8 = "";
    local_a0.m_empty = false;
    local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_90 = boost::unit_test::lazy_ostream::inst;
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_b8 = "";
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x0;
    local_88 = &local_b0;
    boost::test_tools::tt_detail::report_assertion
              (&local_80,&local_a0,1,0,WARN,_cVar5,(size_t)&local_c0,0x2e);
    boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
    std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr
              ((unique_ptr<event_base,_event_base_deleter> *)&local_48);
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x30;
    file_00.m_begin = (iterator)&local_d0;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e0,
               msg_00);
    pmVar1 = std::
             map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
             ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                           *)tags,(key_type *)&local_40);
    local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*pmVar1 == 0);
    local_80.m_message.px = (element_type *)0x0;
    local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_b0 = "tags[base_ptr] == 0";
    local_a8 = "";
    local_a0.m_empty = false;
    local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_90 = boost::unit_test::lazy_ostream::inst;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_e8 = "";
    pvVar3 = (iterator)0x0;
    local_88 = &local_b0;
    boost::test_tools::tt_detail::report_assertion
              (&local_80,&local_a0,1,0,WARN,_cVar5,(size_t)&local_f0,0x30);
    boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
    local_48._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
    super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
         (tuple<event_base_*,_event_base_deleter>)
         (_Tuple_impl<0UL,_event_base_*,_event_base_deleter>)0x0;
    local_f8._M_head_impl = (event_base *)event_base_new();
    if (local_f8._M_head_impl == (event_base *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"cannot create event_base");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      pvVar4 = (iterator)0x0;
      local_100._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
           (tuple<event_base_*,_event_base_deleter>)event_new(local_f8._M_head_impl,0xffffffff,0,0);
      local_40.super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
           (_Head_base<0UL,_event_base_*,_false>)
           (_Head_base<0UL,_event_base_*,_false>)local_f8._M_head_impl;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_108 = "";
      local_120 = &boost::unit_test::basic_cstring<char_const>::null;
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x3a;
      file_01.m_begin = (iterator)&local_110;
      msg_01.m_end = pvVar3;
      msg_01.m_begin = pvVar4;
      local_48._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
           local_100._M_t.super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
           super__Head_base<0UL,_event_base_*,_false>._M_head_impl;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_120,
                 msg_01);
      pmVar1 = std::
               map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
               ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                             *)tags,(key_type *)&local_40);
      local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*pmVar1 == 1);
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b0 = "tags[base_ptr] == 1";
      local_a8 = "";
      local_a0.m_empty = false;
      local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_90 = boost::unit_test::lazy_ostream::inst;
      local_130 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_128 = "";
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x0;
      local_88 = &local_b0;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_a0,1,0,WARN,_cVar5,(size_t)&local_130,0x3a);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_138 = "";
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x3b;
      file_02.m_begin = (iterator)&local_140;
      msg_02.m_end = pvVar4;
      msg_02.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_150,
                 msg_02);
      pmVar1 = std::
               map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
               ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                             *)tags,(key_type *)&local_48);
      local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*pmVar1 == 1);
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b0 = "tags[event_ptr] == 1";
      local_a8 = "";
      local_a0.m_empty = false;
      local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_90 = boost::unit_test::lazy_ostream::inst;
      local_160 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_158 = "";
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x0;
      local_88 = &local_b0;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_a0,1,0,WARN,_cVar5,(size_t)&local_160,0x3b);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      std::unique_ptr<event,_event_deleter>::~unique_ptr
                ((unique_ptr<event,_event_deleter> *)&local_100);
      std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr
                ((unique_ptr<event_base,_event_base_deleter> *)&local_f8);
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x3d;
      file_03.m_begin = (iterator)&local_170;
      msg_03.m_end = pvVar4;
      msg_03.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
                 msg_03);
      pmVar1 = std::
               map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
               ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                             *)tags,(key_type *)&local_40);
      local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*pmVar1 == 0);
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b0 = "tags[base_ptr] == 0";
      local_a8 = "";
      local_a0.m_empty = false;
      local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_90 = boost::unit_test::lazy_ostream::inst;
      local_88 = &local_b0;
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_188 = "";
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_a0,1,0,WARN,_cVar5,(size_t)&local_190,0x3d);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      local_1a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
      ;
      local_198 = "";
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x3e;
      file_04.m_begin = (iterator)&local_1a0;
      msg_04.m_end = pvVar4;
      msg_04.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b0,
                 msg_04);
      pmVar1 = std::
               map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
               ::operator[]((map<void_*,_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_short>_>_>
                             *)tags,(key_type *)&local_48);
      local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*pmVar1 == 0);
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b0 = "tags[event_ptr] == 0";
      local_a8 = "";
      local_a0.m_empty = false;
      local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_90 = boost::unit_test::lazy_ostream::inst;
      local_88 = &local_b0;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_a0,1,0,WARN,0xee7223,(size_t)&stack0xfffffffffffffe40,0x3e);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      event_set_mem_functions(malloc,realloc,free);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(raii_event_creation)
{
    event_set_mem_functions(tag_malloc, realloc, tag_free);

    void* base_ptr = nullptr;
    {
        auto base = obtain_event_base();
        base_ptr = (void*)base.get();
        BOOST_CHECK(tags[base_ptr] == 1);
    }
    BOOST_CHECK(tags[base_ptr] == 0);

    void* event_ptr = nullptr;
    {
        auto base = obtain_event_base();
        auto event = obtain_event(base.get(), -1, 0, nullptr, nullptr);

        base_ptr = (void*)base.get();
        event_ptr = (void*)event.get();

        BOOST_CHECK(tags[base_ptr] == 1);
        BOOST_CHECK(tags[event_ptr] == 1);
    }
    BOOST_CHECK(tags[base_ptr] == 0);
    BOOST_CHECK(tags[event_ptr] == 0);

    event_set_mem_functions(malloc, realloc, free);
}